

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O3

void __thiscall AviWriter::setWord(AviWriter *this,uint filePosn,uint size)

{
  int64_t iVar1;
  int *piVar2;
  ostream *poVar3;
  AviWriter *this_00;
  
  iVar1 = SeekFile64(this,this->fOutFid,(ulong)filePosn,0);
  if (-1 < iVar1) {
    this_00 = this;
    addWord(this,size);
    iVar1 = SeekFile64(this_00,this->fOutFid,0,2);
    if (-1 < iVar1) {
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"AVIFileSink::setWord(): SeekFile64 failed (err ",0x2f);
  piVar2 = __errno_location();
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,*piVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
  return;
}

Assistant:

void AviWriter::setWord(unsigned filePosn, unsigned size) {
    do {
        if (SeekFile64(fOutFid, filePosn, SEEK_SET) < 0) break;
        addWord(size);
        if (SeekFile64(fOutFid, 0, SEEK_END) < 0) break; // go back to where we were

        return;
    } while (0);

    // One of the SeekFile64()s failed, probable because we're not a seekable file
    std::cerr << "AVIFileSink::setWord(): SeekFile64 failed (err " << errno << ")\n";
}